

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O1

int __thiscall CTcConstVal::is_equal_to(CTcConstVal *this,CTcConstVal *val)

{
  tc_constval_type_t tVar1;
  long lVar2;
  size_t __n;
  int iVar3;
  int iVar4;
  vbignum_t ext;
  char *ext_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CTcSymFunc *pCVar5;
  CTcSymFunc *pCVar6;
  bool bVar7;
  vbignum_t b;
  vbignum_t b_1;
  vbignum_t local_30;
  vbignum_t local_28;
  
  tVar1 = this->typ_;
  if (tVar1 == TC_CVT_FLOAT) {
    if (val->typ_ != TC_CVT_INT) goto LAB_001fc2f8;
    vbignum_t::vbignum_t(&local_30,(this->val_).floatval_.txt_,(this->val_).floatval_.len_,0);
    lVar2 = (val->val_).intval_;
    ext_00 = (char *)operator_new__(10);
    ext_00[0] = '\n';
    ext_00[1] = '\0';
    ext_00[4] = '\0';
    CVmObjBigNum::set_int_val(ext_00,lVar2);
    iVar3 = CVmObjBigNum::compare_ext(local_30.ext_,ext_00);
    bVar7 = iVar3 == 0;
    local_28.ext_ = ext_00;
LAB_001fc2db:
    operator_delete__(local_28.ext_);
LAB_001fc2e0:
    ext.ext_ = local_30.ext_;
    if (local_30.ext_ == (char *)0x0) goto switchD_001fc31b_caseD_5;
LAB_001fc2ee:
    operator_delete__(ext.ext_);
    goto switchD_001fc31b_caseD_5;
  }
  if ((tVar1 == TC_CVT_INT) && (val->typ_ == TC_CVT_FLOAT)) {
    lVar2 = (this->val_).intval_;
    ext.ext_ = (char *)operator_new__(10);
    ext.ext_[0] = '\n';
    ext.ext_[1] = '\0';
    ext.ext_[4] = '\0';
    CVmObjBigNum::set_int_val(ext.ext_,lVar2);
    vbignum_t::vbignum_t(&local_30,(val->val_).floatval_.txt_,(val->val_).floatval_.len_,0);
    iVar3 = CVmObjBigNum::compare_ext(ext.ext_,local_30.ext_);
    bVar7 = iVar3 == 0;
    if (local_30.ext_ != (char *)0x0) {
      operator_delete__(local_30.ext_);
    }
    goto LAB_001fc2ee;
  }
LAB_001fc2f8:
  if (tVar1 != val->typ_) goto LAB_001fc39b;
  bVar7 = false;
  switch(tVar1) {
  case TC_CVT_NIL:
  case TC_CVT_TRUE:
    bVar7 = true;
    break;
  case TC_CVT_INT:
  case TC_CVT_OBJ:
  case TC_CVT_FUNCPTR:
    bVar7 = (this->val_).intval_ == (val->val_).intval_;
    break;
  case TC_CVT_SSTR:
    __n = (this->val_).floatval_.len_;
    if (__n == (val->val_).floatval_.len_) {
      iVar3 = bcmp((this->val_).floatval_.txt_,(val->val_).floatval_.txt_,__n);
      bVar7 = iVar3 == 0;
      break;
    }
    goto LAB_001fc39b;
  case TC_CVT_LIST:
    pCVar5 = (this->val_).funcptrval_;
    pCVar6 = (val->val_).funcptrval_;
    if (*(int *)&(pCVar5->super_CTcSymFuncBase).super_CTcSymbol.super_CTcSymbolBase.
                 super_CVmHashEntryCS.super_CVmHashEntry.nxt_ ==
        *(int *)&(pCVar6->super_CTcSymFuncBase).super_CTcSymbol.super_CTcSymbolBase.
                 super_CVmHashEntryCS.super_CVmHashEntry.nxt_) {
      do {
        pCVar6 = (CTcSymFunc *)
                 (pCVar6->super_CTcSymFuncBase).super_CTcSymbol.super_CTcSymbolBase.
                 super_CVmHashEntryCS.super_CVmHashEntry.str_;
        pCVar5 = (CTcSymFunc *)
                 (pCVar5->super_CTcSymFuncBase).super_CTcSymbol.super_CTcSymbolBase.
                 super_CVmHashEntryCS.super_CVmHashEntry.str_;
        bVar7 = pCVar6 == (CTcSymFunc *)0x0 || pCVar5 == (CTcSymFunc *)0x0;
        if (bVar7) break;
        iVar3 = (*((pCVar5->super_CTcSymFuncBase).super_CTcSymbol.super_CTcSymbolBase.
                   super_CVmHashEntryCS.super_CVmHashEntry.nxt_)->_vptr_CVmHashEntry[1])();
        iVar4 = (*((pCVar6->super_CTcSymFuncBase).super_CTcSymbol.super_CTcSymbolBase.
                   super_CVmHashEntryCS.super_CVmHashEntry.nxt_)->_vptr_CVmHashEntry[1])();
        iVar3 = is_equal_to((CTcConstVal *)CONCAT44(extraout_var,iVar3),
                            (CTcConstVal *)CONCAT44(extraout_var_00,iVar4));
      } while (iVar3 != 0);
      break;
    }
LAB_001fc39b:
    bVar7 = false;
    break;
  case TC_CVT_PROP:
    bVar7 = (this->val_).propval_ == (val->val_).propval_;
    break;
  case TC_CVT_FLOAT:
    vbignum_t::vbignum_t(&local_30,(this->val_).floatval_.txt_,(this->val_).floatval_.len_,0);
    vbignum_t::vbignum_t(&local_28,(val->val_).floatval_.txt_,(val->val_).floatval_.len_,0);
    iVar3 = CVmObjBigNum::compare_ext(local_30.ext_,local_28.ext_);
    bVar7 = iVar3 == 0;
    if (local_28.ext_ != (char *)0x0) goto LAB_001fc2db;
    goto LAB_001fc2e0;
  }
switchD_001fc31b_caseD_5:
  return (int)bVar7;
}

Assistant:

int CTcConstVal::is_equal_to(const CTcConstVal *val) const
{
    CTPNListEle *ele1;
    CTPNListEle *ele2;

    /* check for float-int comparisons */
    if (typ_ == TC_CVT_INT && val->get_type() == TC_CVT_FLOAT)
    {
        vbignum_t a(get_val_int());
        vbignum_t b(val->get_val_float(), val->get_val_float_len(), 0);
        return a.compare(b) == 0;
    }
    if (typ_ == TC_CVT_FLOAT && val->get_type() == TC_CVT_INT)
    {
        vbignum_t a(get_val_float(), get_val_float_len(), 0);
        vbignum_t b(val->get_val_int());
        return a.compare(b) == 0;
    }
    
    /* 
     *   if the types aren't equal, the values are not equal; otherwise,
     *   check the various types 
     */
    if (typ_ != val->get_type())
    {
        /* the types aren't equal, so the values are not equal */
        return FALSE;
    }

    /* the types are the same; do the comparison based on the type */
    switch(typ_)
    {
    case TC_CVT_UNK:
        /* unknown type; unknown values can never be equal */
        return FALSE;

    case TC_CVT_TRUE:
    case TC_CVT_NIL:
        /* 
         *   nil==nil and true==true; since we know the types are the
         *   same, the values are the same
         */
        return TRUE;

    case TC_CVT_INT:
        /* compare the integers */
        return (get_val_int() == val->get_val_int());

    case TC_CVT_FLOAT:
        {
            vbignum_t a(get_val_float(), get_val_float_len(), 0);
            vbignum_t b(val->get_val_float(), val->get_val_float_len(), 0);
            return a.compare(b) == 0;
        }

    case TC_CVT_SSTR:
        /* compare the strings */
        return (get_val_str_len() == val->get_val_str_len()
                && memcmp(get_val_str(), val->get_val_str(),
                          get_val_str_len()) == 0);
            
    case TC_CVT_LIST:
        /* 
         *   if the lists don't have the same number of elements, they're
         *   not equal 
         */
        if (get_val_list()->get_count() != val->get_val_list()->get_count())
            return FALSE;

        /* 
         *   compare each element of each list; if they're all the same,
         *   the values are the same 
         */
        ele1 = get_val_list()->get_head();
        ele2 = val->get_val_list()->get_head();
        for ( ; ele1 != 0 && ele2 != 0 ;
              ele1 = ele1->get_next(), ele2 = ele2->get_next())
        {
            /* if these elements aren't equal, the lists aren't equal */
            if (!ele1->get_expr()->get_const_val()
                ->is_equal_to(ele2->get_expr()->get_const_val()))
                return FALSE;
        }

        /* we didn't find any differences, so the lists are equal */
        return TRUE;

    case TC_CVT_OBJ:
        /* if the object values are the same, the values match */
        return (get_val_obj() == val->get_val_obj());

    case TC_CVT_PROP:
        /* if the property values are the same, the values match */
        return (get_val_prop() == val->get_val_prop());

    case TC_CVT_FUNCPTR:
        /* 
         *   if both symbols are the same, the values match; otherwise,
         *   they refer to different functions 
         */
        return (get_val_funcptr_sym() == val->get_val_funcptr_sym());

    default:
        /* unknown type; return unequal */
        return FALSE;
    }
}